

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Game::getGuessedNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Game *this)

{
  bool bVar1;
  char *pcVar2;
  int local_50;
  int local_4c;
  undefined1 local_45;
  int i;
  undefined1 local_38 [8];
  string input;
  Game *this_local;
  vector<int,_std::allocator<int>_> *guessedNumbers;
  
  input.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  while (bVar1 = isInputValid(this,(string *)local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Enter 4 numbers from 0 to 9:\n");
    std::operator>>((istream *)&std::cin,(string *)local_38);
  }
  local_45 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,4);
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    local_50 = *pcVar2 + -0x30;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_50);
  }
  local_45 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> Game::getGuessedNumbers()
{
	std::string input{};
	while (not isInputValid(input))
	{
		std::cout << "Enter 4 numbers from 0 to 9:\n";
		std::cin >> input;
	}
	std::vector<int32_t> guessedNumbers;
	guessedNumbers.reserve(length);
	for (auto i = 0; i < length; ++i)
		guessedNumbers.push_back(input[i] - '0');
	return guessedNumbers;
}